

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9WriteSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Wrd_t *pVVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  Vec_Wrd_t *local_50;
  int nArgcNew;
  char **pArgvNew;
  int fVerbose;
  int fOutputs;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar2 = false;
  bVar3 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar4 = Extra_UtilGetopt(argc,argv,"ovh");
    if (iVar4 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9WriteSim(): There is no AIG.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar4 = Gia_ManRegNum(pAbc->pGia);
        if (iVar4 < 1) {
          if (bVar2) {
            local_50 = pAbc->pGia->vSimsPo;
          }
          else {
            local_50 = pAbc->pGia->vSimsPi;
          }
          if (local_50 == (Vec_Wrd_t *)0x0) {
            Abc_Print(-1,
                      "Abc_CommandAbc9WriteSim(): Does not have simulation information available.\n"
                     );
            pAbc_local._4_4_ = 0;
          }
          else {
            lVar6 = (long)globalUtilOptind;
            if (argc - globalUtilOptind == 1) {
              if (bVar2) {
                iVar4 = Vec_WrdSize(pAbc->pGia->vSimsPo);
                iVar5 = Gia_ManCoNum(pAbc->pGia);
                if (iVar4 % iVar5 != 0) {
                  __assert_fail("Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                                ,0x814e,"int Abc_CommandAbc9WriteSim(Abc_Frame_t *, int, char **)");
                }
                pcVar7 = argv[lVar6];
                pVVar1 = pAbc->pGia->vSimsPo;
                iVar4 = Vec_WrdSize(pAbc->pGia->vSimsPo);
                iVar5 = Gia_ManCoNum(pAbc->pGia);
                Vec_WrdDumpHex(pcVar7,pVVar1,iVar4 / iVar5,1);
              }
              else {
                iVar4 = Vec_WrdSize(pAbc->pGia->vSimsPi);
                iVar5 = Gia_ManCiNum(pAbc->pGia);
                if (iVar4 % iVar5 != 0) {
                  __assert_fail("Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                                ,0x8153,"int Abc_CommandAbc9WriteSim(Abc_Frame_t *, int, char **)");
                }
                pcVar7 = argv[lVar6];
                pVVar1 = pAbc->pGia->vSimsPi;
                iVar4 = Vec_WrdSize(pAbc->pGia->vSimsPi);
                iVar5 = Gia_ManCiNum(pAbc->pGia);
                Vec_WrdDumpHex(pcVar7,pVVar1,iVar4 / iVar5,1);
              }
              pAbc_local._4_4_ = 0;
            }
            else {
              Abc_Print(-1,"File name is not given on the command line.\n");
              pAbc_local._4_4_ = 1;
            }
          }
        }
        else {
          Abc_Print(-1,
                    "Abc_CommandAbc9WriteSim(): This command works only for combinational AIGs.\n");
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    if (iVar4 == 0x68) break;
    if (iVar4 == 0x6f) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar4 != 0x76) break;
      bVar3 = (bool)(bVar3 ^ 1);
    }
  }
  Abc_Print(-2,"usage: &sim_write [-vh] <file>\n");
  Abc_Print(-2,"\t         writes simulation patterns into a file\n");
  pcVar7 = "no";
  if (bVar2) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-o     : toggle writing output information [default = %s]\n",pcVar7);
  pcVar7 = "no";
  if (bVar3) {
    pcVar7 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : file to store the simulation info\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9WriteSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fOutputs = 0, fVerbose = 0;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'o':
            fOutputs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    if ( (fOutputs ? pAbc->pGia->vSimsPo : pAbc->pGia->vSimsPi) == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9WriteSim(): Does not have simulation information available.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fOutputs )
    {
        assert( Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) == 0 );
        Vec_WrdDumpHex( pArgvNew[0], pAbc->pGia->vSimsPo, Vec_WrdSize(pAbc->pGia->vSimsPo) / Gia_ManCoNum(pAbc->pGia), 1 );
    }
    else
    {
        assert( Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) == 0 );
        Vec_WrdDumpHex( pArgvNew[0], pAbc->pGia->vSimsPi, Vec_WrdSize(pAbc->pGia->vSimsPi) / Gia_ManCiNum(pAbc->pGia), 1 );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_write [-vh] <file>\n" );
    Abc_Print( -2, "\t         writes simulation patterns into a file\n" );
    Abc_Print( -2, "\t-o     : toggle writing output information [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}